

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_int rf_get_ktx_image_size(void *src,rf_int src_size)

{
  ulong uVar1;
  _Bool _Var2;
  rf_int rVar3;
  rf_ktx_header header;
  
  if (0x3f < (ulong)src_size && src != (void *)0x0) {
    header.id._0_8_ = *src;
    header._8_8_ = *(undefined8 *)((long)src + 8);
    header._16_8_ = *(undefined8 *)((long)src + 0x10);
    header._24_8_ = *(undefined8 *)((long)src + 0x18);
    header._32_8_ = *(undefined8 *)((long)src + 0x20);
    header._40_8_ = *(undefined8 *)((long)src + 0x28);
    header._48_8_ = *(undefined8 *)((long)src + 0x30);
    header._56_8_ = *(ulong *)((long)src + 0x38);
    uVar1 = (ulong)header._56_8_ >> 0x20;
    _Var2 = rf_match_str_cstr(header.id + 1,6,"KTX 11");
    rVar3 = 0;
    if ((_Var2) && (4 < (src_size - uVar1) - 0x40)) {
      rVar3 = (rf_int)*(int *)((long)src + uVar1 + 0x40);
    }
    return rVar3;
  }
  return 0;
}

Assistant:

RF_API rf_int rf_get_ktx_image_size(const void* src, rf_int src_size)
{
    int result = 0;

    if (src && src_size >= sizeof(rf_ktx_header))
    {
        rf_ktx_header header = *(rf_ktx_header*)src;
        src = (char*)src + sizeof(rf_ktx_header) + header.key_value_data_size;
        src_size -= sizeof(rf_ktx_header) + header.key_value_data_size;

        if (rf_match_str_cstr(header.id + 1, 6, "KTX 11"))
        {
            if (src_size > sizeof(unsigned int))
            {
                memcpy(&result, src, sizeof(unsigned int));
            }
        }
    }

    return result;
}